

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O2

BayesianGameBase * __thiscall
BayesianGameBase::operator=(BayesianGameBase *this,BayesianGameBase *o)

{
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__x;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *__x_00;
  size_t sVar1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *this_01;
  size_t *psVar2;
  
  if (this != o) {
    this->_m_useSparse = o->_m_useSparse;
    std::vector<double,_std::allocator<double>_>::operator=(&this->_m_jTypeProbs,&o->_m_jTypeProbs);
    boost::numeric::ublas::
    mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
    ::operator=(&this->_m_jTypeProbsSparse,&o->_m_jTypeProbsSparse);
    __x = o->_m_jointToIndTypes;
    if (__x == (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)0x0) {
      this_00 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)0x0;
    }
    else {
      this_00 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)operator_new(0x18);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(this_00,__x);
    }
    this->_m_jointToIndTypes = this_00;
    __x_00 = &o->_m_jointToIndTypesMap->_M_t;
    if (__x_00 == (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                   *)0x0) {
      this_01 = (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 *)0x0;
    }
    else {
      this_01 = (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 *)operator_new(0x30);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::_Rb_tree(this_01,__x_00);
    }
    this->_m_jointToIndTypesMap =
         (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          *)this_01;
    this->_m_initialized = o->_m_initialized;
    this->_m_verboseness = o->_m_verboseness;
    this->_m_nrAgents = o->_m_nrAgents;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&this->_m_nrActions,&o->_m_nrActions);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&this->_m_nrTypes,&o->_m_nrTypes);
    sVar1 = o->_m_nrJA;
    this->_m_nrJTypes = o->_m_nrJTypes;
    this->_m_nrJA = sVar1;
    psVar2 = IndexTools::CalculateStepSize(&this->_m_nrTypes);
    this->_m_stepSizeTypes = psVar2;
    psVar2 = IndexTools::CalculateStepSize(&this->_m_nrActions);
    this->_m_stepSizeActions = psVar2;
  }
  return this;
}

Assistant:

BayesianGameBase& BayesianGameBase::operator= (const BayesianGameBase& o)
{
    if (this == &o) return *this;   // Gracefully handle self assignment

    Interface_ProblemToPolicyDiscretePure::operator=(o);

    _m_useSparse=o._m_useSparse;
    _m_jTypeProbs=o._m_jTypeProbs;
    _m_jTypeProbsSparse=o._m_jTypeProbsSparse;

    if(o._m_jointToIndTypes)
        _m_jointToIndTypes=new vector<vector<Index> >(*o._m_jointToIndTypes);
    else
        _m_jointToIndTypes=0;
    if(o._m_jointToIndTypesMap)
        _m_jointToIndTypesMap=new map<Index, vector<Index> >(*o._m_jointToIndTypesMap);
    else
        _m_jointToIndTypesMap=0;

    _m_initialized=o._m_initialized;
    _m_verboseness=o._m_verboseness;
    _m_nrAgents=o._m_nrAgents;
    _m_nrActions=o._m_nrActions;
    _m_nrTypes=o._m_nrTypes;
    _m_nrJTypes=o._m_nrJTypes;
    _m_nrJA=o._m_nrJA;
    _m_stepSizeTypes = IndexTools::CalculateStepSize(_m_nrTypes);
    _m_stepSizeActions = IndexTools::CalculateStepSize(_m_nrActions);
    
    return *this;
}